

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_factory.cxx
# Opt level: O3

cse_abstract * __thiscall
factory_item<xray_re::cse_alife_human_stalker>::create
          (factory_item<xray_re::cse_alife_human_stalker> *this)

{
  cse_alife_trader_abstract *this_00;
  
  this_00 = (cse_alife_trader_abstract *)operator_new(800);
  xray_re::cse_alife_trader_abstract::cse_alife_trader_abstract(this_00);
  xray_re::cse_alife_monster_abstract::cse_alife_monster_abstract
            ((cse_alife_monster_abstract *)(this_00 + 1));
  this_00->_vptr_cse_alife_trader_abstract = (_func_int **)&PTR_state_merge_00248790;
  this_00[1]._vptr_cse_alife_trader_abstract = (_func_int **)&PTR__cse_alife_human_abstract_002487e0
  ;
  *(undefined ***)&this_00[3].m_money = &PTR__cse_alife_human_abstract_00248848;
  this_00[4].m_unk1_u8 = '\0';
  this_00[4].m_unk2_u8 = '\0';
  *(undefined6 *)&this_00[4].field_0x82 = 0;
  this_00[5]._vptr_cse_alife_trader_abstract = (_func_int **)0x0;
  this_00[5].m_money = 0;
  this_00[5].m_trader_flags = 0;
  this_00[5].m_community_index = 0;
  this_00[5].m_reputation = 0;
  *(undefined8 *)&this_00[5].m_rank = 0;
  this_00[5].m_character_profile._M_dataplus._M_p = (pointer)0x0;
  xray_re::cse_ph_skeleton::cse_ph_skeleton
            ((cse_ph_skeleton *)&this_00[5].m_character_profile._M_string_length);
  this_00->_vptr_cse_alife_trader_abstract = (_func_int **)&PTR_state_merge_002488a8;
  this_00[1]._vptr_cse_alife_trader_abstract = (_func_int **)&PTR__cse_alife_human_stalker_002488f8;
  *(undefined ***)&this_00[3].m_money = &PTR__cse_alife_human_stalker_00248960;
  this_00[5].m_character_profile._M_string_length =
       (size_type)&PTR__cse_alife_human_stalker_00248988;
  *(size_type **)((long)&this_00[5].m_specific_character.field_2 + 8) =
       &this_00[5].m_character_name._M_string_length;
  this_00[5].m_character_name._M_dataplus._M_p = (pointer)0x0;
  *(undefined1 *)&this_00[5].m_character_name._M_string_length = 0;
  *(anon_union_8_3_e9edf90f_for_xr_clsid_0 *)&this_00[2].m_rank =
       (this->super_factory_item_base).m_clsid.field_0;
  return (cse_abstract *)(cse_alife_monster_abstract *)(this_00 + 1);
}

Assistant:

cse_abstract* factory_item<T>::create()
{
	T* p = new T;
	p->clsid() = clsid();
	return p;
}